

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::drawArraysInstanced
          (ReferenceContext *this,deUint32 mode,int first,int count,int instanceCount)

{
  bool bVar1;
  PrimitiveType primitiveType;
  PrimitiveList PStack_48;
  
  if ((count | first | instanceCount) < 0) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else {
    bVar1 = predrawErrorChecks(this,mode);
    if (bVar1) {
      primitiveType = rr_util::mapGLPrimitiveType(mode);
      rr::PrimitiveList::PrimitiveList(&PStack_48,primitiveType,count,first);
      drawWithReference(this,&PStack_48,instanceCount);
    }
  }
  return;
}

Assistant:

void ReferenceContext::drawArraysInstanced (deUint32 mode, int first, int count, int instanceCount)
{
	// Error conditions
	{
		RC_IF_ERROR(first < 0 || count < 0 || instanceCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

		if (!predrawErrorChecks(mode))
			return;
	}

	// All is ok
	{
		const rr::PrimitiveType primitiveType = sglr::rr_util::mapGLPrimitiveType(mode);

		drawWithReference(rr::PrimitiveList(primitiveType, count, first), instanceCount);
	}
}